

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  undefined8 this_00;
  bool bVar1;
  byte bVar2;
  cmMakefile *this_01;
  string *psVar3;
  ulong uVar4;
  pointer pcVar5;
  reference obj;
  reference pbVar6;
  ostream *poVar7;
  string *stamp_dir_00;
  string local_718;
  string local_6f8;
  string local_6d8;
  char local_6b1;
  undefined1 local_6b0 [8];
  string stamp;
  undefined1 local_688 [8];
  string mod_lower;
  undefined1 local_660 [8];
  string mod_upper;
  string *i_2;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratedFileStream fcStream;
  string fcName;
  string *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *provides;
  cmGeneratedFileStream fiStream;
  string fiName;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
  *i;
  const_iterator __end1;
  const_iterator __begin1;
  ObjectInfoMap *__range1;
  ObjectInfoMap *objInfo;
  string local_b0;
  byte local_8d;
  bool building_intrinsics;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string mod_dir;
  cmMakefile *mf;
  string *stamp_dir;
  ostream *internalDepends_local;
  ostream *makeDepends_local;
  cmDependsFortran *this_local;
  
  bVar1 = LocateModules(this);
  if (bVar1) {
    stamp_dir_00 = &(this->super_cmDepends).TargetDirectory;
    this_01 = cmLocalGenerator::GetMakefile
                        ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
    mod_dir.field_2._8_8_ = this_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_Fortran_TARGET_MODULE_DIR",&local_79);
    psVar3 = cmMakefile::GetSafeDefinition(this_01,&local_78);
    std::__cxx11::string::string((string *)local_58,(string *)psVar3);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                         ((cmLocalGenerator *)(this->super_cmDepends).LocalGenerator);
      std::__cxx11::string::operator=((string *)local_58,(string *)psVar3);
    }
    this_00 = mod_dir.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES",
               (allocator<char> *)((long)&objInfo + 7));
    cmMakefile::GetSafeDefinition((cmMakefile *)this_00,&local_b0);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&objInfo + 7));
    local_8d = (bVar2 ^ 0xff) & 1;
    pcVar5 = std::
             unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ::operator->(&this->Internal);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
             ::begin(&pcVar5->ObjectInfo);
    i = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>_>
           ::end(&pcVar5->ObjectInfo);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&i), bVar1) {
      obj = std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
            ::operator*(&__end1);
      bVar1 = WriteDependenciesReal
                        (this,&obj->first,&obj->second,(string *)local_58,stamp_dir_00,makeDepends,
                         internalDepends,(bool)(local_8d & 1));
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_00b63495;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmFortranSourceInfo>_>
      ::operator++(&__end1);
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[18]>
              ((string *)&fiStream.field_0x260,&(this->super_cmDepends).TargetDirectory,
               (char (*) [18])"/fortran.internal");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&provides,(string *)&fiStream.field_0x260,false,None);
    std::operator<<((ostream *)&provides,"# The fortran modules provided by this target.\n");
    std::operator<<((ostream *)&provides,"provides\n");
    pcVar5 = std::
             unique_ptr<cmDependsFortranInternals,_std::default_delete<cmDependsFortranInternals>_>
             ::operator->(&this->Internal);
    __end1_1 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pcVar5->TargetProvides);
    i_1 = (string *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&pcVar5->TargetProvides);
    while (bVar1 = std::operator!=(&__end1_1,(_Self *)&i_1), bVar1) {
      pbVar6 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1_1);
      poVar7 = std::operator<<((ostream *)&provides,' ');
      poVar7 = std::operator<<(poVar7,(string *)pbVar6);
      std::operator<<(poVar7,'\n');
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1_1);
    }
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pcVar5->TargetProvides);
    if (!bVar1) {
      cmStrCat<std::__cxx11::string&,char_const(&)[27]>
                ((string *)&fcStream.field_0x260,&(this->super_cmDepends).TargetDirectory,
                 (char (*) [27])"/cmake_clean_Fortran.cmake");
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)&__range2,(string *)&fcStream.field_0x260,false,None);
      std::operator<<((ostream *)&__range2,"# Remove fortran modules provided by this target.\n");
      std::operator<<((ostream *)&__range2,"FILE(REMOVE");
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&pcVar5->TargetProvides);
      i_2 = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&pcVar5->TargetProvides);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&i_2), bVar1) {
        mod_upper.field_2._8_8_ =
             std::
             _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
        mod_lower.field_2._M_local_buf[0xf] = '/';
        cmStrCat<std::__cxx11::string&,char>
                  ((string *)local_660,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   mod_lower.field_2._M_local_buf + 0xf);
        stamp.field_2._M_local_buf[0xf] = '/';
        cmStrCat<std::__cxx11::string&,char>
                  ((string *)local_688,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   stamp.field_2._M_local_buf + 0xf);
        cmFortranModuleAppendUpperLower
                  ((string *)mod_upper.field_2._8_8_,(string *)local_660,(string *)local_688);
        local_6b1 = '/';
        cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[7]>
                  ((string *)local_6b0,stamp_dir_00,&local_6b1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   mod_upper.field_2._8_8_,(char (*) [7])".stamp");
        poVar7 = std::operator<<((ostream *)&__range2,"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_6d8,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,
                   (string *)local_688);
        poVar7 = std::operator<<(poVar7,(string *)&local_6d8);
        poVar7 = std::operator<<(poVar7,"\"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_6f8,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,
                   (string *)local_660);
        poVar7 = std::operator<<(poVar7,(string *)&local_6f8);
        poVar7 = std::operator<<(poVar7,"\"\n  \"");
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_718,(cmOutputConverter *)(this->super_cmDepends).LocalGenerator,
                   (string *)local_6b0);
        poVar7 = std::operator<<(poVar7,(string *)&local_718);
        std::operator<<(poVar7,"\"\n");
        std::__cxx11::string::~string((string *)&local_718);
        std::__cxx11::string::~string((string *)&local_6f8);
        std::__cxx11::string::~string((string *)&local_6d8);
        std::__cxx11::string::~string((string *)local_6b0);
        std::__cxx11::string::~string((string *)local_688);
        std::__cxx11::string::~string((string *)local_660);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      std::operator<<((ostream *)&__range2,"  )\n");
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range2);
      std::__cxx11::string::~string((string *)&fcStream.field_0x260);
    }
    this_local._7_1_ = true;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&provides);
    std::__cxx11::string::~string((string *)&fiStream.field_0x260);
LAB_00b63495:
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  if (!this->LocateModules()) {
    return false;
  }

  // Get the directory in which stamp files will be stored.
  const std::string& stamp_dir = this->TargetDirectory;

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  bool building_intrinsics =
    !mf->GetSafeDefinition("CMAKE_Fortran_TARGET_BUILDING_INSTRINSIC_MODULES")
       .empty();

  // Actually write dependencies to the streams.
  using ObjectInfoMap = cmDependsFortranInternals::ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (auto const& i : objInfo) {
    if (!this->WriteDependenciesReal(i.first, i.second, mod_dir, stamp_dir,
                                     makeDepends, internalDepends,
                                     building_intrinsics)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = cmStrCat(this->TargetDirectory, "/fortran.internal");
  cmGeneratedFileStream fiStream(fiName);
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::string const& i : provides) {
    fiStream << ' ' << i << '\n';
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName =
      cmStrCat(this->TargetDirectory, "/cmake_clean_Fortran.cmake");
    cmGeneratedFileStream fcStream(fcName);
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    for (std::string const& i : provides) {
      std::string mod_upper = cmStrCat(mod_dir, '/');
      std::string mod_lower = cmStrCat(mod_dir, '/');
      cmFortranModuleAppendUpperLower(i, mod_upper, mod_lower);
      std::string stamp = cmStrCat(stamp_dir, '/', i, ".stamp");
      fcStream << "\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_lower)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(mod_upper)
               << "\"\n"
                  "  \""
               << this->LocalGenerator->MaybeRelativeToCurBinDir(stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}